

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::StringMaker<signed_char,void>::convert_abi_cxx11_(char value)

{
  char in_SIL;
  string *in_RDI;
  char chstr [4];
  uint *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffffd9;
  undefined2 in_stack_ffffffffffffffda;
  undefined2 uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_a [10];
  
  if (in_SIL == '\r') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,
                                CONCAT22(in_stack_ffffffffffffffda,
                                         CONCAT11(in_stack_ffffffffffffffd9,
                                                  in_stack_ffffffffffffffd8))),
               in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator(local_a);
  }
  else if (in_SIL == '\f') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,
                                CONCAT22(in_stack_ffffffffffffffda,
                                         CONCAT11(in_stack_ffffffffffffffd9,
                                                  in_stack_ffffffffffffffd8))),
               in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
  }
  else if (in_SIL == '\n') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,
                                CONCAT22(in_stack_ffffffffffffffda,
                                         CONCAT11(in_stack_ffffffffffffffd9,
                                                  in_stack_ffffffffffffffd8))),
               in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
  }
  else if (in_SIL == '\t') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,
                                CONCAT22(in_stack_ffffffffffffffda,
                                         CONCAT11(in_stack_ffffffffffffffd9,
                                                  in_stack_ffffffffffffffd8))),
               in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe1);
  }
  else if ((in_SIL < '\0') || ('\x1f' < in_SIL)) {
    uVar1 = 0x27;
    uVar2 = 0x27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,
               (char *)CONCAT44(in_stack_ffffffffffffffdc,CONCAT22(uVar2,CONCAT11(in_SIL,uVar1))),
               in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  }
  else {
    Detail::stringify<unsigned_int>(in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

std::string StringMaker<signed char>::convert(signed char value) {
    if (value == '\r') {
        return "'\\r'";
    } else if (value == '\f') {
        return "'\\f'";
    } else if (value == '\n') {
        return "'\\n'";
    } else if (value == '\t') {
        return "'\\t'";
    } else if ('\0' <= value && value < ' ') {
        return ::Catch::Detail::stringify(static_cast<unsigned int>(value));
    } else {
        char chstr[] = "' '";
        chstr[1] = value;
        return chstr;
    }
}